

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

nifti_1_header * nifti_convert_nim2nhdr(nifti_1_header *__return_storage_ptr__,nifti_image *nim)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  byte bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  bVar13 = 0;
  memset(__return_storage_ptr__->data_type,0,0x158);
  __return_storage_ptr__->sizeof_hdr = 0x15c;
  __return_storage_ptr__->regular = 'r';
  auVar15._0_4_ = (int)(short)nim->nt;
  auVar15._4_4_ = (int)(short)nim->nu;
  auVar15._8_4_ = (int)(short)nim->nv;
  auVar15._12_4_ = (int)(short)nim->nw;
  auVar14._0_4_ = (int)(short)nim->ndim;
  auVar14._4_4_ = (int)(short)nim->nx;
  auVar14._8_4_ = (int)(short)nim->ny;
  auVar14._12_4_ = (int)(short)nim->nz;
  auVar14 = packssdw(auVar14,auVar15);
  *(undefined1 (*) [16])__return_storage_ptr__->dim = auVar14;
  fVar5 = nim->dx;
  fVar6 = nim->dy;
  fVar7 = nim->dz;
  fVar8 = nim->dt;
  __return_storage_ptr__->pixdim[1] = fVar5;
  __return_storage_ptr__->pixdim[2] = fVar6;
  __return_storage_ptr__->pixdim[3] = fVar7;
  __return_storage_ptr__->pixdim[4] = fVar8;
  uVar3._0_4_ = nim->du;
  uVar3._4_4_ = nim->dv;
  *(ulong *)(__return_storage_ptr__->pixdim + 5) = uVar3;
  fVar1 = nim->dw;
  __return_storage_ptr__->pixdim[7] = fVar1;
  __return_storage_ptr__->datatype = (short)nim->datatype;
  __return_storage_ptr__->bitpix = (short)(nim->nbyper << 3);
  fVar2 = nim->cal_min;
  if (fVar2 < nim->cal_max) {
    __return_storage_ptr__->cal_max = nim->cal_max;
    __return_storage_ptr__->cal_min = fVar2;
  }
  fVar2 = nim->scl_slope;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    __return_storage_ptr__->scl_slope = fVar2;
    __return_storage_ptr__->scl_inter = nim->scl_inter;
  }
  if (nim->descrip[0] != '\0') {
    pcVar11 = nim->descrip;
    pcVar12 = __return_storage_ptr__->descrip;
    for (lVar10 = 0x4f; lVar10 != 0; lVar10 = lVar10 + -1) {
      *pcVar12 = *pcVar11;
      pcVar11 = pcVar11 + (ulong)bVar13 * -2 + 1;
      pcVar12 = pcVar12 + (ulong)bVar13 * -2 + 1;
    }
    __return_storage_ptr__->descrip[0x4f] = '\0';
  }
  if (nim->aux_file[0] != '\0') {
    *(undefined8 *)(__return_storage_ptr__->aux_file + 0xf) = *(undefined8 *)(nim->aux_file + 0xf);
    uVar4 = *(undefined8 *)(nim->aux_file + 8);
    *(undefined8 *)__return_storage_ptr__->aux_file = *(undefined8 *)nim->aux_file;
    *(undefined8 *)(__return_storage_ptr__->aux_file + 8) = uVar4;
    __return_storage_ptr__->aux_file[0x17] = '\0';
  }
  if (0 < nim->nifti_type) {
    uVar9 = 0x31696e;
    if (nim->nifti_type == 1) {
      uVar9 = 0x312b6e;
    }
    *(undefined4 *)__return_storage_ptr__->magic = uVar9;
    __return_storage_ptr__->pixdim[1] = ABS(fVar5);
    __return_storage_ptr__->pixdim[2] = ABS(fVar6);
    __return_storage_ptr__->pixdim[3] = ABS(fVar7);
    __return_storage_ptr__->pixdim[4] = ABS(fVar8);
    *(ulong *)(__return_storage_ptr__->pixdim + 5) = uVar3 & 0x7fffffff7fffffff;
    __return_storage_ptr__->pixdim[7] = ABS(fVar1);
    __return_storage_ptr__->intent_code = (short)nim->intent_code;
    fVar1 = nim->intent_p2;
    __return_storage_ptr__->intent_p1 = nim->intent_p1;
    __return_storage_ptr__->intent_p2 = fVar1;
    __return_storage_ptr__->intent_p3 = nim->intent_p3;
    if (nim->intent_name[0] != '\0') {
      uVar4 = *(undefined8 *)nim->intent_name;
      *(undefined8 *)(__return_storage_ptr__->intent_name + 7) =
           *(undefined8 *)(nim->intent_name + 7);
      *(undefined8 *)__return_storage_ptr__->intent_name = uVar4;
      __return_storage_ptr__->intent_name[0xf] = '\0';
    }
    __return_storage_ptr__->vox_offset = (float)nim->iname_offset;
    __return_storage_ptr__->xyzt_units = (byte)nim->time_units & 0x38 | (byte)nim->xyz_units & 7;
    __return_storage_ptr__->toffset = nim->toffset;
    if (0 < nim->qform_code) {
      __return_storage_ptr__->qform_code = (short)nim->qform_code;
      fVar1 = nim->quatern_c;
      fVar2 = nim->quatern_d;
      fVar5 = nim->qoffset_x;
      __return_storage_ptr__->quatern_b = nim->quatern_b;
      __return_storage_ptr__->quatern_c = fVar1;
      __return_storage_ptr__->quatern_d = fVar2;
      __return_storage_ptr__->qoffset_x = fVar5;
      fVar1 = nim->qoffset_z;
      __return_storage_ptr__->qoffset_y = nim->qoffset_y;
      __return_storage_ptr__->qoffset_z = fVar1;
      __return_storage_ptr__->pixdim[0] = *(float *)(&DAT_00112138 + (ulong)(0.0 <= nim->qfac) * 4);
    }
    if (0 < nim->sform_code) {
      __return_storage_ptr__->sform_code = (short)nim->sform_code;
      uVar4 = *(undefined8 *)((nim->sto_xyz).m[0] + 2);
      *(undefined8 *)__return_storage_ptr__->srow_x = *(undefined8 *)(nim->sto_xyz).m[0];
      *(undefined8 *)(__return_storage_ptr__->srow_x + 2) = uVar4;
      uVar4 = *(undefined8 *)((nim->sto_xyz).m[1] + 2);
      *(undefined8 *)__return_storage_ptr__->srow_y = *(undefined8 *)(nim->sto_xyz).m[1];
      *(undefined8 *)(__return_storage_ptr__->srow_y + 2) = uVar4;
      uVar4 = *(undefined8 *)((nim->sto_xyz).m[2] + 2);
      *(undefined8 *)__return_storage_ptr__->srow_z = *(undefined8 *)(nim->sto_xyz).m[2];
      *(undefined8 *)(__return_storage_ptr__->srow_z + 2) = uVar4;
    }
    __return_storage_ptr__->dim_info =
         (byte)((nim->slice_dim & 3U) << 4) |
         ((byte)nim->freq_dim & 3) + ((byte)nim->phase_dim & 3) * '\x04';
    __return_storage_ptr__->slice_code = (char)nim->slice_code;
    __return_storage_ptr__->slice_start = (short)nim->slice_start;
    __return_storage_ptr__->slice_end = (short)nim->slice_end;
    __return_storage_ptr__->slice_duration = nim->slice_duration;
  }
  return __return_storage_ptr__;
}

Assistant:

struct nifti_1_header nifti_convert_nim2nhdr(const nifti_image * nim)
{
   struct nifti_1_header nhdr;

   memset(&nhdr,0,sizeof(nhdr)) ;  /* zero out header, to be safe */


   /**- load the ANALYZE-7.5 generic parts of the header struct */

   nhdr.sizeof_hdr = sizeof(nhdr) ;
   nhdr.regular    = 'r' ;             /* for some stupid reason */

   nhdr.dim[0] = nim->ndim ;
   nhdr.dim[1] = nim->nx ; nhdr.dim[2] = nim->ny ; nhdr.dim[3] = nim->nz ;
   nhdr.dim[4] = nim->nt ; nhdr.dim[5] = nim->nu ; nhdr.dim[6] = nim->nv ;
   nhdr.dim[7] = nim->nw ;

   nhdr.pixdim[0] = 0.0f ;
   nhdr.pixdim[1] = nim->dx ; nhdr.pixdim[2] = nim->dy ;
   nhdr.pixdim[3] = nim->dz ; nhdr.pixdim[4] = nim->dt ;
   nhdr.pixdim[5] = nim->du ; nhdr.pixdim[6] = nim->dv ;
   nhdr.pixdim[7] = nim->dw ;

   nhdr.datatype = nim->datatype ;
   nhdr.bitpix   = 8 * nim->nbyper ;

   if( nim->cal_max > nim->cal_min ){
     nhdr.cal_max = nim->cal_max ;
     nhdr.cal_min = nim->cal_min ;
   }

   if( nim->scl_slope != 0.0 ){
     nhdr.scl_slope = nim->scl_slope ;
     nhdr.scl_inter = nim->scl_inter ;
   }

   if( nim->descrip[0] != '\0' ){
     memcpy(nhdr.descrip ,nim->descrip ,79) ; nhdr.descrip[79] = '\0' ;
   }
   if( nim->aux_file[0] != '\0' ){
     memcpy(nhdr.aux_file ,nim->aux_file ,23) ; nhdr.aux_file[23] = '\0' ;
   }

   /**- Load NIFTI specific stuff into the header */

   if( nim->nifti_type > NIFTI_FTYPE_ANALYZE ){ /* then not ANALYZE */

     if( nim->nifti_type == NIFTI_FTYPE_NIFTI1_1 ) strcpy(nhdr.magic,"n+1") ;
     else                                          strcpy(nhdr.magic,"ni1") ;

     nhdr.pixdim[1] = (float)fabs(nhdr.pixdim[1]) ; nhdr.pixdim[2] = (float)fabs(nhdr.pixdim[2]) ;
     nhdr.pixdim[3] = (float)fabs(nhdr.pixdim[3]) ; nhdr.pixdim[4] = (float)fabs(nhdr.pixdim[4]) ;
     nhdr.pixdim[5] = (float)fabs(nhdr.pixdim[5]) ; nhdr.pixdim[6] = (float)fabs(nhdr.pixdim[6]) ;
     nhdr.pixdim[7] = (float)fabs(nhdr.pixdim[7]) ;

     nhdr.intent_code = nim->intent_code ;
     nhdr.intent_p1   = nim->intent_p1 ;
     nhdr.intent_p2   = nim->intent_p2 ;
     nhdr.intent_p3   = nim->intent_p3 ;
     if( nim->intent_name[0] != '\0' ){
       memcpy(nhdr.intent_name,nim->intent_name,15) ;
       nhdr.intent_name[15] = '\0' ;
     }

     nhdr.vox_offset  = (float) nim->iname_offset ;
     nhdr.xyzt_units  = SPACE_TIME_TO_XYZT( nim->xyz_units, nim->time_units ) ;
     nhdr.toffset     = nim->toffset ;

     if( nim->qform_code > 0 ){
       nhdr.qform_code = nim->qform_code ;
       nhdr.quatern_b  = nim->quatern_b ;
       nhdr.quatern_c  = nim->quatern_c ;
       nhdr.quatern_d  = nim->quatern_d ;
       nhdr.qoffset_x  = nim->qoffset_x ;
       nhdr.qoffset_y  = nim->qoffset_y ;
       nhdr.qoffset_z  = nim->qoffset_z ;
       nhdr.pixdim[0]  = (nim->qfac >= 0.0) ? 1.0f : -1.0f ;
     }

     if( nim->sform_code > 0 ){
       nhdr.sform_code = nim->sform_code ;
       nhdr.srow_x[0]  = nim->sto_xyz.m[0][0] ;
       nhdr.srow_x[1]  = nim->sto_xyz.m[0][1] ;
       nhdr.srow_x[2]  = nim->sto_xyz.m[0][2] ;
       nhdr.srow_x[3]  = nim->sto_xyz.m[0][3] ;
       nhdr.srow_y[0]  = nim->sto_xyz.m[1][0] ;
       nhdr.srow_y[1]  = nim->sto_xyz.m[1][1] ;
       nhdr.srow_y[2]  = nim->sto_xyz.m[1][2] ;
       nhdr.srow_y[3]  = nim->sto_xyz.m[1][3] ;
       nhdr.srow_z[0]  = nim->sto_xyz.m[2][0] ;
       nhdr.srow_z[1]  = nim->sto_xyz.m[2][1] ;
       nhdr.srow_z[2]  = nim->sto_xyz.m[2][2] ;
       nhdr.srow_z[3]  = nim->sto_xyz.m[2][3] ;
     }

     nhdr.dim_info = FPS_INTO_DIM_INFO( nim->freq_dim ,
                                        nim->phase_dim , nim->slice_dim ) ;
     nhdr.slice_code     = nim->slice_code ;
     nhdr.slice_start    = nim->slice_start ;
     nhdr.slice_end      = nim->slice_end ;
     nhdr.slice_duration = nim->slice_duration ;
   }

   return nhdr;
}